

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

char * __thiscall
sentencepiece::SelfTestData_Sample::_InternalParse
          (SelfTestData_Sample *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  string *psVar2;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar3;
  uint32 *local_68;
  string *str_1;
  string *str;
  uint32 tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  SelfTestData_Sample *this_local;
  string *local_28;
  InternalMetadata *local_20;
  uint32 *local_18;
  InternalMetadata *local_10;
  
  local_68 = (uint32 *)((long)&str + 4);
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  local_18 = local_68;
  do {
    *local_68 = 0;
    local_68 = local_68 + 1;
  } while (local_68 != &tag);
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(_tag,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_002c9f88;
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ReadTag((char *)ctx_local,(uint32 *)&str,0);
      tag_00 = (uint)str;
      if (ctx_local == (ParseContext *)0x0) goto LAB_002c9fa6;
      if ((uint)str >> 3 != 1) break;
      if (((uint)str & 0xff) == 10) {
        psVar2 = _internal_mutable_input_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar2,(char *)ctx_local,_tag);
      }
      else {
LAB_002c9ed2:
        if ((((uint)str & 7) == 4) || ((uint)str == 0)) {
          google::protobuf::internal::EpsCopyInputStream::SetLastTag
                    (&_tag->super_EpsCopyInputStream,(uint)str);
          goto LAB_002c9f88;
        }
        this_local = (SelfTestData_Sample *)&(this->super_MessageLite)._internal_metadata_;
        local_20 = (InternalMetadata *)this_local;
        local_10 = (InternalMetadata *)this_local;
        if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
          pCVar3 = google::protobuf::internal::InternalMetadata::
                   PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                             ((InternalMetadata *)this_local);
          local_28 = &pCVar3->unknown_fields;
        }
        else {
          local_28 = google::protobuf::internal::InternalMetadata::
                     mutable_unknown_fields_slow<std::__cxx11::string>
                               ((InternalMetadata *)this_local);
        }
        ctx_local = (ParseContext *)
                    google::protobuf::internal::UnknownFieldParse
                              (tag_00,local_28,(char *)ctx_local,_tag);
      }
      if (ctx_local == (ParseContext *)0x0) goto LAB_002c9fa6;
    }
    if (((uint)str >> 3 != 2) || (((uint)str & 0xff) != 0x12)) goto LAB_002c9ed2;
    psVar2 = _internal_mutable_expected_abi_cxx11_(this);
    ctx_local = (ParseContext *)
                google::protobuf::internal::InlineGreedyStringParser(psVar2,(char *)ctx_local,_tag);
  } while (ctx_local != (ParseContext *)0x0);
LAB_002c9fa6:
  ctx_local = (ParseContext *)0x0;
LAB_002c9f88:
  google::protobuf::internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
  return (char *)ctx_local;
}

Assistant:

const char* SelfTestData_Sample::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string input = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_input();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string expected = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_expected();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}